

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O1

void parse_assignment(LexState *ls,LHSVarList *lh,BCReg nvars)

{
  BCReg *pBVar1;
  FuncState *fs;
  bool bVar2;
  BCReg BVar3;
  undefined4 uVar4;
  LHSVarList *pLVar5;
  LHSVarList vl;
  anon_union_8_3_2ce71dea_for_u local_40;
  undefined8 local_38;
  undefined4 local_30;
  LHSVarList *local_28;
  
  if (3 < (lh->v).k - VLOCAL) {
    err_syntax(ls,LJ_ERR_XSYNTAX);
  }
  if (ls->tok == 0x2c) {
    lj_lex_next(ls);
    local_28 = lh;
    expr_primary(ls,(ExpDesc *)&local_40.s);
    if (((int)local_38 == 6) && (lh != (LHSVarList *)0x0)) {
      fs = ls->fs;
      BVar3 = fs->freereg;
      bVar2 = false;
      pLVar5 = lh;
      do {
        if ((pLVar5->v).k == VINDEXED) {
          if ((pLVar5->v).u.s.info == local_40.s.info) {
            (pLVar5->v).u.s.info = BVar3;
            bVar2 = true;
          }
          if ((pLVar5->v).u.s.aux == local_40.s.info) {
            (pLVar5->v).u.s.aux = BVar3;
            bVar2 = true;
          }
        }
        pLVar5 = pLVar5->prev;
      } while (pLVar5 != (LHSVarList *)0x0);
      if (bVar2) {
        bcemit_INS(fs,local_40.s.info << 0x10 | BVar3 << 8 | 0x12);
        bcreg_reserve(fs,1);
      }
    }
    if (199 < ls->level + nvars) {
      err_limit(ls->fs,200,"variable names");
    }
    parse_assignment(ls,(LHSVarList *)&local_40.s,nvars + 1);
  }
  else {
    lex_check(ls,0x3d);
    BVar3 = expr_list(ls,(ExpDesc *)&local_40.s);
    if (BVar3 == nvars) {
      if ((int)local_38 == 0xd) {
        if ((char)ls->fs->bcbase[local_40.s.info].ins == 'G') {
          pBVar1 = &ls->fs->freereg;
          *pBVar1 = *pBVar1 - 1;
          uVar4 = 0xb;
        }
        else {
          local_40.s.info = local_40.s.aux;
          uVar4 = 0xc;
        }
        local_38 = CONCAT44(local_38._4_4_,uVar4);
      }
      bcemit_store(ls->fs,&lh->v,(ExpDesc *)&local_40.s);
    }
    else {
      assign_adjust(ls,nvars,BVar3,(ExpDesc *)&local_40.s);
    }
    if (BVar3 == nvars) {
      return;
    }
  }
  local_40.s.info = ls->fs->freereg - 1;
  local_38 = 0xffffffff0000000c;
  local_30 = 0xffffffff;
  bcemit_store(ls->fs,&lh->v,(ExpDesc *)&local_40.s);
  return;
}

Assistant:

static void parse_assignment(LexState *ls, LHSVarList *lh, BCReg nvars)
{
  ExpDesc e;
  checkcond(ls, VLOCAL <= lh->v.k && lh->v.k <= VINDEXED, LJ_ERR_XSYNTAX);
  if (lex_opt(ls, ',')) {  /* Collect LHS list and recurse upwards. */
    LHSVarList vl;
    vl.prev = lh;
    expr_primary(ls, &vl.v);
    if (vl.v.k == VLOCAL)
      assign_hazard(ls, lh, &vl.v);
    checklimit(ls->fs, ls->level + nvars, LJ_MAX_XLEVEL, "variable names");
    parse_assignment(ls, &vl, nvars+1);
  } else {  /* Parse RHS. */
    BCReg nexps;
    lex_check(ls, '=');
    nexps = expr_list(ls, &e);
    if (nexps == nvars) {
      if (e.k == VCALL) {
	if (bc_op(*bcptr(ls->fs, &e)) == BC_VARG) {  /* Vararg assignment. */
	  ls->fs->freereg--;
	  e.k = VRELOCABLE;
	} else {  /* Multiple call results. */
	  e.u.s.info = e.u.s.aux;  /* Base of call is not relocatable. */
	  e.k = VNONRELOC;
	}
      }
      bcemit_store(ls->fs, &lh->v, &e);
      return;
    }
    assign_adjust(ls, nvars, nexps, &e);
  }
  /* Assign RHS to LHS and recurse downwards. */
  expr_init(&e, VNONRELOC, ls->fs->freereg-1);
  bcemit_store(ls->fs, &lh->v, &e);
}